

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void trace_start(jit_State *J)

{
  lua_State *L_00;
  TValue *pTVar1;
  TraceNo TVar2;
  uint uVar3;
  ptrdiff_t argbase_00;
  GCstr *pGVar4;
  BCOp op;
  ptrdiff_t argbase;
  TraceNo traceno;
  lua_State *L;
  jit_State *J_local;
  
  if ((J->pt->flags & 8) == 0) {
    TVar2 = trace_findfree(J);
    if (TVar2 == 0) {
      lj_trace_flushall(J->L);
      J->state = LJ_TRACE_IDLE;
    }
    else {
      J->trace[TVar2].gcptr64 = (uint64_t)J;
      memset(J,0,0x78);
      (J->cur).traceno = (TraceNo1)TVar2;
      (J->cur).nk = 0x8000;
      (J->cur).nins = 0x8000;
      (J->cur).ir = J->irbuf;
      (J->cur).snap = J->snapbuf;
      (J->cur).snapmap = J->snapmapbuf;
      J->mergesnap = '\0';
      J->needsnap = '\0';
      J->bcskip = '\0';
      (J->guardemit).irt = '\0';
      J->postproc = LJ_POST_NONE;
      J->retryrec = '\0';
      J->ktrace = 0;
      (J->cur).startpt.gcptr64 = (uint64_t)J->pt;
      L_00 = J->L;
      if (((*(byte *)((L_00->glref).ptr64 + 0x93) & 2) != 0) &&
         (argbase_00 = lj_vmevent_prepare(L_00,LJ_VMEVENT_TRACE), argbase_00 != 0)) {
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        pGVar4 = lj_str_new(L_00,"start",5);
        pTVar1->u64 = (ulong)pGVar4 | 0xfffd800000000000;
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        pTVar1->n = (double)(int)TVar2;
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        pTVar1->u64 = (ulong)J->fn | 0xfffb800000000000;
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        pTVar1->n = (double)(int)((long)J->pc - (long)(J->pt + 1) >> 2);
        if (J->parent == 0) {
          uVar3 = *J->pc & 0xff;
          if (((uVar3 == 0x41) || (uVar3 == 0x42)) || (uVar3 == 0x45)) {
            pTVar1 = L_00->top;
            L_00->top = pTVar1 + 1;
            pTVar1->n = (double)(int)J->exitno;
            pTVar1 = L_00->top;
            L_00->top = pTVar1 + 1;
            pTVar1->u64 = 0xbff0000000000000;
          }
        }
        else {
          pTVar1 = L_00->top;
          L_00->top = pTVar1 + 1;
          pTVar1->n = (double)(int)J->parent;
          pTVar1 = L_00->top;
          L_00->top = pTVar1 + 1;
          pTVar1->n = (double)(int)J->exitno;
        }
        lj_vmevent_call(L_00,argbase_00);
      }
      lj_record_setup(J);
    }
  }
  else {
    if (((J->parent == 0) && (J->exitno == 0)) && ((*J->pc & 0xff) != 0x46)) {
      *(char *)J->pc = (char)*J->pc + '\x01';
      J->pt->flags = J->pt->flags | 0x10;
    }
    J->state = LJ_TRACE_IDLE;
  }
  return;
}

Assistant:

static void trace_start(jit_State *J)
{
  lua_State *L;
  TraceNo traceno;
#ifdef LUA_USE_TRACE_LOGS
  const BCIns *pc = J->pc;
#endif

  if ((J->pt->flags & PROTO_NOJIT)) {  /* JIT disabled for this proto? */
    if (J->parent == 0 && J->exitno == 0 && bc_op(*J->pc) != BC_ITERN) {
      /* Lazy bytecode patching to disable hotcount events. */
      lj_assertJ(bc_op(*J->pc) == BC_FORL || bc_op(*J->pc) == BC_ITERL ||
		 bc_op(*J->pc) == BC_LOOP || bc_op(*J->pc) == BC_FUNCF,
		 "bad hot bytecode %d", bc_op(*J->pc));
      setbc_op(J->pc, (int)bc_op(*J->pc)+(int)BC_ILOOP-(int)BC_LOOP);
      J->pt->flags |= PROTO_ILOOP;
    }
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }

  /* Get a new trace number. */
  traceno = trace_findfree(J);
  if (LJ_UNLIKELY(traceno == 0)) {  /* No free trace? */
    lj_assertJ((J2G(J)->hookmask & HOOK_GC) == 0,
	       "recorder called from GC hook");
    lj_trace_flushall(J->L);
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }
  setgcrefp(J->trace[traceno], &J->cur);

  /* Setup enough of the current trace to be able to send the vmevent. */
  memset(&J->cur, 0, sizeof(GCtrace));
  J->cur.traceno = traceno;
  J->cur.nins = J->cur.nk = REF_BASE;
  J->cur.ir = J->irbuf;
  J->cur.snap = J->snapbuf;
  J->cur.snapmap = J->snapmapbuf;
  J->mergesnap = 0;
  J->needsnap = 0;
  J->bcskip = 0;
  J->guardemit.irt = 0;
  J->postproc = LJ_POST_NONE;
  lj_resetsplit(J);
  J->retryrec = 0;
  J->ktrace = 0;
  setgcref(J->cur.startpt, obj2gco(J->pt));

  L = J->L;
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "start"));
    setintV(L->top++, traceno);
    setfuncV(L, L->top++, J->fn);
    setintV(L->top++, proto_bcpos(J->pt, J->pc));
    if (J->parent) {
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
    } else {
      BCOp op = bc_op(*J->pc);
      if (op == BC_CALLM || op == BC_CALL || op == BC_ITERC) {
	setintV(L->top++, J->exitno);  /* Parent of stitched trace. */
	setintV(L->top++, -1);
      }
    }
  );
  lj_record_setup(J);
#ifdef LUA_USE_TRACE_LOGS
  lj_log_trace_start_record(L, (unsigned) J->cur.traceno, pc, J->fn);
#endif
}